

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_helper_polar<ExchCXX::BuiltinEPC17_2>
               (int N,const_host_buffer_type rho,host_buffer_type eps)

{
  uint in_EAX;
  uint uVar1;
  long lVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (0 < N) {
    lVar2 = 0;
    do {
      auVar8 = *(undefined1 (*) [16])((long)rho + lVar2 * 2);
      dVar5 = 0.0;
      if (1e-24 < auVar8._8_8_ + auVar8._0_8_) {
        auVar8 = maxpd(_DAT_01040f80,auVar8);
        dVar9 = auVar8._8_8_;
        dVar7 = auVar8._0_8_;
        dVar4 = dVar7 + dVar9;
        dVar6 = 1.0 / dVar4;
        dVar5 = (dVar7 - dVar9) * dVar6;
        auVar8._8_8_ = -(ulong)(dVar6 * (dVar9 + dVar9) <= 1e-15);
        auVar8._0_8_ = -(ulong)(dVar6 * (dVar7 + dVar7) <= 1e-15);
        uVar1 = movmskpd(in_EAX,auVar8);
        dVar6 = 1.9999999999999991;
        if ((uVar1 & 2) == 0) {
          dVar6 = dVar5 + 1.0;
        }
        bVar3 = (uVar1 & 1) == 0;
        dVar11 = 9.992007221626409e-16;
        if (bVar3) {
          dVar11 = dVar6;
        }
        dVar6 = 1.9999999999999991;
        if (bVar3) {
          dVar6 = 1.0 - dVar5;
        }
        dVar10 = 9.992007221626409e-16;
        if ((uVar1 & 2) == 0) {
          dVar10 = dVar6;
        }
        dVar6 = dVar4 * dVar4 * dVar11 * dVar10;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        in_EAX = -(uint)(dVar9 <= 1e-24 && dVar7 <= 1e-24);
        dVar5 = 0.0;
        if ((in_EAX & 1) == 0) {
          dVar5 = (-1.0 / ((2.35 - dVar6 * 2.4 * 0.5) + dVar4 * dVar4 * dVar10 * dVar11 * 6.6 * 0.25
                          )) * dVar10 * dVar4 * dVar11 * 0.25;
        }
      }
      *(double *)((long)eps + lVar2) = dVar5;
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

LDA_EXC_GENERATOR( host_eval_exc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;
    traits::eval_exc_polar( rho_i[0], rho_i[1], eps[i] );

  }

}